

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::InitializePipelineDesc
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this,
          GraphicsPipelineStateCreateInfo *CreateInfo,FixedLinearAllocator *MemPool)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  IRenderPass *pIVar4;
  AttachmentReference *pAVar5;
  LayoutElement *pLVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  FixedLinearAllocator *MemPool_00;
  int iVar11;
  GraphicsPipelineData *pGVar12;
  RenderDeviceGLImpl *pRVar13;
  undefined4 extraout_var;
  RenderPassBase<Diligent::EngineGLImplTraits> *this_00;
  SubpassDesc *pSVar14;
  LayoutElement *pLayoutElements;
  Char *pCVar15;
  Uint32 *pUVar16;
  size_t sVar17;
  char (*in_RCX) [57];
  ulong uVar18;
  Uint32 UVar19;
  long lVar20;
  ulong uVar21;
  AttachmentReference *DSAttachmentRef;
  string msg;
  string local_60;
  FixedLinearAllocator *local_40;
  PipelineStateBase<Diligent::EngineGLImplTraits> *local_38;
  
  pGVar12 = FixedLinearAllocator::
            Construct<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::GraphicsPipelineData>
                      (MemPool);
  (this->field_6).m_pGraphicsPipelineData = pGVar12;
  MemPool->m_pAllocator = (IMemoryAllocator *)0x0;
  local_40 = MemPool;
  if ((GraphicsPipelineData *)MemPool->m_pDataStart != (this->field_6).m_pGraphicsPipelineData) {
    FormatString<char[26],char[29]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Ptr == m_pPipelineDataRawMem",(char (*) [29])in_RCX);
    in_RCX = (char (*) [57])0x3b7;
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"InitializePipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x3b7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  pGVar12 = (this->field_6).m_pGraphicsPipelineData;
  memcpy(pGVar12,&CreateInfo->GraphicsPipeline,0xbc);
  pRVar13 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                       );
  CorrectGraphicsPipelineDesc
            (&pGVar12->Desc,
             &(pRVar13->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Features)
  ;
  MemPool_00 = local_40;
  CopyResourceLayout(&(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout,
                     &(this->
                      super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                      ).m_Desc.ResourceLayout,local_40);
  CopyResourceSignatures(this,&CreateInfo->super_PipelineStateCreateInfo,MemPool_00);
  RefCntAutoPtr<Diligent::IRenderPass>::operator=(&pGVar12->pRenderPass,(pGVar12->Desc).pRenderPass)
  ;
  pIVar4 = (pGVar12->pRenderPass).m_pObject;
  if (pIVar4 != (IRenderPass *)0x0) {
    iVar11 = (*(pIVar4->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    lVar20 = CONCAT44(extraout_var,iVar11);
    if (*(uint *)(lVar20 + 0x18) <= (uint)(pGVar12->Desc).SubpassIndex) {
      FormatString<char[26],char[52]>
                (&local_60,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GraphicsPipeline.SubpassIndex < RPDesc.SubpassCount",
                 (char (*) [52])in_RCX);
      in_RCX = (char (*) [57])0x3c8;
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"InitializePipelineDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    this_00 = &RefCntAutoPtr<Diligent::IRenderPass>::RawPtr<Diligent::RenderPassGLImpl>
                         (&pGVar12->pRenderPass)->super_RenderPassBase<Diligent::EngineGLImplTraits>
    ;
    pSVar14 = RenderPassBase<Diligent::EngineGLImplTraits>::GetSubpass
                        (this_00,(uint)(pGVar12->Desc).SubpassIndex);
    UVar19 = pSVar14->RenderTargetAttachmentCount;
    (pGVar12->Desc).NumRenderTargets = (Uint8)UVar19;
    if (UVar19 != 0) {
      uVar21 = 0;
      do {
        pAVar5 = pSVar14->pRenderTargetAttachments;
        uVar3 = pAVar5[uVar21].AttachmentIndex;
        if (uVar3 != 0xffffffff) {
          if (*(uint *)(lVar20 + 8) <= uVar3) {
            FormatString<char[26],char[57]>
                      (&local_60,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                       in_RCX);
            DebugAssertionFailed
                      (local_60._M_dataplus._M_p,"InitializePipelineDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                       ,0x3d1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
          }
          in_RCX = (char (*) [57])((ulong)pAVar5[uVar21].AttachmentIndex * 0x10);
          (pGVar12->Desc).RTVFormats[uVar21] =
               *(TEXTURE_FORMAT *)(*in_RCX + *(long *)(lVar20 + 0x10));
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < pSVar14->RenderTargetAttachmentCount);
    }
    pAVar5 = pSVar14->pDepthStencilAttachment;
    if ((pAVar5 != (AttachmentReference *)0x0) && (pAVar5->AttachmentIndex != 0xffffffff)) {
      if (*(uint *)(lVar20 + 8) <= pAVar5->AttachmentIndex) {
        FormatString<char[26],char[57]>
                  (&local_60,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",in_RCX)
        ;
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"InitializePipelineDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x3db);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      in_RCX = (char (*) [57])((ulong)pAVar5->AttachmentIndex * 0x10);
      (pGVar12->Desc).DSVFormat = *(TEXTURE_FORMAT *)(*in_RCX + *(long *)(lVar20 + 0x10));
    }
  }
  uVar21 = (ulong)(pGVar12->Desc).InputLayout.NumElements;
  if (uVar21 == 0) {
    pLayoutElements = (LayoutElement *)0x0;
  }
  else {
    pLayoutElements = FixedLinearAllocator::ConstructArray<Diligent::LayoutElement>(local_40,uVar21)
    ;
    UVar19 = (pGVar12->Desc).InputLayout.NumElements;
    if (UVar19 != 0) {
      lVar20 = 0;
      uVar21 = 0;
      local_38 = this;
      do {
        pLVar6 = (pGVar12->Desc).InputLayout.LayoutElements;
        *(undefined8 *)(&pLayoutElements->Frequency + lVar20) =
             *(undefined8 *)(&pLVar6->Frequency + lVar20);
        puVar1 = (undefined8 *)((long)&pLVar6->HLSLSemantic + lVar20);
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pLVar6->NumComponents + lVar20);
        uVar9 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pLayoutElements->NumComponents + lVar20);
        *puVar2 = *puVar1;
        puVar2[1] = uVar9;
        puVar1 = (undefined8 *)((long)&pLayoutElements->HLSLSemantic + lVar20);
        *puVar1 = uVar7;
        puVar1[1] = uVar8;
        if (*(long *)((long)&pLVar6->HLSLSemantic + lVar20) == 0) {
          FormatString<char[26],char[32]>
                    (&local_60,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"SrcElem.HLSLSemantic != nullptr",(char (*) [32])in_RCX);
          in_RCX = (char (*) [57])0x3ea;
          DebugAssertionFailed
                    (local_60._M_dataplus._M_p,"InitializePipelineDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                     ,0x3ea);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
        }
        pCVar15 = FixedLinearAllocator::CopyString
                            (local_40,*(char **)((long)&pLVar6->HLSLSemantic + lVar20),0);
        *(Char **)((long)&pLayoutElements->HLSLSemantic + lVar20) = pCVar15;
        uVar21 = uVar21 + 1;
        UVar19 = (pGVar12->Desc).InputLayout.NumElements;
        lVar20 = lVar20 + 0x28;
        this = local_38;
      } while (uVar21 < UVar19);
    }
    ResolveInputLayoutAutoOffsetsAndStrides
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,pLayoutElements,
               UVar19);
    _Var10._M_p = local_60._M_dataplus._M_p;
    uVar21 = local_60._M_string_length - (long)local_60._M_dataplus._M_p >> 2;
    pGVar12->BufferSlotsUsed = (Uint8)uVar21;
    uVar21 = uVar21 & 0xff;
    pUVar16 = (Uint32 *)FixedLinearAllocator::Allocate(local_40,(ulong)(uint)((int)uVar21 * 4),4);
    if (uVar21 != 0) {
      uVar18 = 0;
      do {
        pUVar16[uVar18] = *(Uint32 *)(_Var10._M_p + uVar18 * 4);
        uVar18 = uVar18 + 1;
      } while (uVar21 != uVar18);
    }
    pGVar12->pStrides = pUVar16;
    if (local_60._M_dataplus._M_p != (Char *)0x0) {
      operator_delete(local_60._M_dataplus._M_p,
                      local_60.field_2._M_allocated_capacity - (long)local_60._M_dataplus._M_p);
    }
  }
  (pGVar12->Desc).InputLayout.LayoutElements = pLayoutElements;
  sVar17 = ComputeRenderTargetFormatsHash
                     ((uint)(pGVar12->Desc).NumRenderTargets,(pGVar12->Desc).RTVFormats,
                      (pGVar12->Desc).DSVFormat);
  ((this->field_6).m_pGraphicsPipelineData)->dvpRenderTargetFormatsHash = sVar17;
  return;
}

Assistant:

void InitializePipelineDesc(const GraphicsPipelineStateCreateInfo& CreateInfo,
                                FixedLinearAllocator&                  MemPool)
    {
        this->m_pGraphicsPipelineData = MemPool.Construct<GraphicsPipelineData>();
        void* Ptr                     = MemPool.ReleaseOwnership();
        VERIFY_EXPR(Ptr == m_pPipelineDataRawMem);

        GraphicsPipelineDesc&       GraphicsPipeline = this->m_pGraphicsPipelineData->Desc;
        RefCntAutoPtr<IRenderPass>& pRenderPass      = this->m_pGraphicsPipelineData->pRenderPass;
        Uint8&                      BufferSlotsUsed  = this->m_pGraphicsPipelineData->BufferSlotsUsed;
        Uint32*&                    pStrides         = this->m_pGraphicsPipelineData->pStrides;

        GraphicsPipeline = CreateInfo.GraphicsPipeline;
        CorrectGraphicsPipelineDesc(GraphicsPipeline, this->GetDevice()->GetDeviceInfo().Features);

        CopyResourceLayout(CreateInfo.PSODesc.ResourceLayout, this->m_Desc.ResourceLayout, MemPool);
        CopyResourceSignatures(CreateInfo, MemPool);

        pRenderPass = GraphicsPipeline.pRenderPass;
        if (pRenderPass)
        {
            const RenderPassDesc& RPDesc = pRenderPass->GetDesc();
            VERIFY_EXPR(GraphicsPipeline.SubpassIndex < RPDesc.SubpassCount);
            const SubpassDesc& Subpass = pRenderPass.template RawPtr<RenderPassImplType>()->GetSubpass(GraphicsPipeline.SubpassIndex);

            GraphicsPipeline.NumRenderTargets = static_cast<Uint8>(Subpass.RenderTargetAttachmentCount);
            for (Uint32 rt = 0; rt < Subpass.RenderTargetAttachmentCount; ++rt)
            {
                const AttachmentReference& RTAttachmentRef = Subpass.pRenderTargetAttachments[rt];
                if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                {
                    VERIFY_EXPR(RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
                    GraphicsPipeline.RTVFormats[rt] = RPDesc.pAttachments[RTAttachmentRef.AttachmentIndex].Format;
                }
            }

            if (Subpass.pDepthStencilAttachment != nullptr)
            {
                const AttachmentReference& DSAttachmentRef = *Subpass.pDepthStencilAttachment;
                if (DSAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                {
                    VERIFY_EXPR(DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
                    GraphicsPipeline.DSVFormat = RPDesc.pAttachments[DSAttachmentRef.AttachmentIndex].Format;
                }
            }
        }

        const InputLayoutDesc& InputLayout     = GraphicsPipeline.InputLayout;
        LayoutElement*         pLayoutElements = nullptr;
        if (InputLayout.NumElements > 0)
        {
            pLayoutElements = MemPool.ConstructArray<LayoutElement>(InputLayout.NumElements);
            for (size_t Elem = 0; Elem < InputLayout.NumElements; ++Elem)
            {
                const LayoutElement& SrcElem = InputLayout.LayoutElements[Elem];
                pLayoutElements[Elem]        = SrcElem;
                VERIFY_EXPR(SrcElem.HLSLSemantic != nullptr);
                pLayoutElements[Elem].HLSLSemantic = MemPool.CopyString(SrcElem.HLSLSemantic);
            }

            // Correct description and compute offsets and tight strides
            const std::vector<Uint32> Strides = ResolveInputLayoutAutoOffsetsAndStrides(pLayoutElements, InputLayout.NumElements);
            BufferSlotsUsed                   = static_cast<Uint8>(Strides.size());

            pStrides = MemPool.CopyConstructArray<Uint32>(Strides.data(), BufferSlotsUsed);
        }
        GraphicsPipeline.InputLayout.LayoutElements = pLayoutElements;

#ifdef DILIGENT_DEVELOPMENT
        this->m_pGraphicsPipelineData->dvpRenderTargetFormatsHash = ComputeRenderTargetFormatsHash(
            GraphicsPipeline.NumRenderTargets, GraphicsPipeline.RTVFormats, GraphicsPipeline.DSVFormat);
#endif
    }